

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Def.cpp
# Opt level: O2

string * __thiscall hdc::Def::getName_abi_cxx11_(string *__return_storage_ptr__,Def *this)

{
  string *psVar1;
  
  psVar1 = Token::getLexem_abi_cxx11_(&this->name);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Def::getName() {
    return name.getLexem();
}